

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O0

spv_result_t spvtools::val::ConstantPass(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  spv_result_t sVar4;
  int32_t iVar5;
  uint32_t uVar6;
  DiagnosticStream *this;
  DiagnosticStream local_210;
  undefined4 local_38;
  undefined4 local_34;
  spv_result_t error_5;
  spv_result_t error_4;
  spv_result_t error_3;
  spv_result_t error_2;
  spv_result_t error_1;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _error_1 = inst;
  inst_local = (Instruction *)_;
  OVar3 = Instruction::opcode(inst);
  switch(OVar3) {
  case OpConstantTrue:
  case OpConstantFalse:
  case OpSpecConstantTrue:
  case OpSpecConstantFalse:
    sVar4 = anon_unknown_2::ValidateConstantBool((ValidationState_t *)inst_local,_error_1);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    error_2 = SPV_SUCCESS;
    break;
  default:
    break;
  case OpConstantComposite:
  case OpSpecConstantComposite:
    sVar4 = anon_unknown_2::ValidateConstantComposite((ValidationState_t *)inst_local,_error_1);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    error_3 = SPV_SUCCESS;
    break;
  case OpConstantSampler:
    sVar4 = anon_unknown_2::ValidateConstantSampler((ValidationState_t *)inst_local,_error_1);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    error_4 = SPV_SUCCESS;
    break;
  case OpConstantNull:
    sVar4 = anon_unknown_2::ValidateConstantNull((ValidationState_t *)inst_local,_error_1);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    error_5 = SPV_SUCCESS;
    break;
  case OpSpecConstant:
    sVar4 = anon_unknown_2::ValidateSpecConstant((ValidationState_t *)inst_local,_error_1);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    local_34 = 0;
    break;
  case OpSpecConstantOp:
    sVar4 = anon_unknown_2::ValidateSpecConstantOp((ValidationState_t *)inst_local,_error_1);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    local_38 = 0;
  }
  OVar3 = Instruction::opcode(_error_1);
  iVar5 = spvOpcodeIsConstant(OVar3);
  if ((iVar5 != 0) &&
     (bVar2 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityShader),
     pIVar1 = inst_local, bVar2)) {
    uVar6 = Instruction::type_id(_error_1);
    bVar2 = ValidationState_t::IsPointerType((ValidationState_t *)pIVar1,uVar6);
    pIVar1 = inst_local;
    if (!bVar2) {
      uVar6 = Instruction::type_id(_error_1);
      bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType((ValidationState_t *)pIVar1,uVar6)
      ;
      if (bVar2) {
        ValidationState_t::diag
                  (&local_210,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_error_1);
        this = DiagnosticStream::operator<<
                         (&local_210,(char (*) [44])"Cannot form constants of 8- or 16-bit types");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this);
        DiagnosticStream::~DiagnosticStream(&local_210);
        return __local._4_4_;
      }
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ConstantPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpConstantTrue:
    case spv::Op::OpConstantFalse:
    case spv::Op::OpSpecConstantTrue:
    case spv::Op::OpSpecConstantFalse:
      if (auto error = ValidateConstantBool(_, inst)) return error;
      break;
    case spv::Op::OpConstantComposite:
    case spv::Op::OpSpecConstantComposite:
      if (auto error = ValidateConstantComposite(_, inst)) return error;
      break;
    case spv::Op::OpConstantSampler:
      if (auto error = ValidateConstantSampler(_, inst)) return error;
      break;
    case spv::Op::OpConstantNull:
      if (auto error = ValidateConstantNull(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstant:
      if (auto error = ValidateSpecConstant(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstantOp:
      if (auto error = ValidateSpecConstantOp(_, inst)) return error;
      break;
    default:
      break;
  }

  // Generally disallow creating 8- or 16-bit constants unless the full
  // capabilities are present.
  if (spvOpcodeIsConstant(inst->opcode()) &&
      _.HasCapability(spv::Capability::Shader) &&
      !_.IsPointerType(inst->type_id()) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Cannot form constants of 8- or 16-bit types";
  }

  return SPV_SUCCESS;
}